

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O1

void __thiscall
QScrollbarStyleAnimation::QScrollbarStyleAnimation
          (QScrollbarStyleAnimation *this,Mode mode,QObject *target)

{
  undefined4 uVar1;
  undefined4 uVar2;
  
  QNumberStyleAnimation::QNumberStyleAnimation((QNumberStyleAnimation *)this,target);
  *(undefined ***)this = &PTR_metaObject_007fb300;
  *(Mode *)(this + 0x40) = mode;
  this[0x44] = (QScrollbarStyleAnimation)0x0;
  if (mode == Deactivating) {
    *(undefined8 *)(this + 0x10) = 0x28a000001c2;
    uVar1 = 0x3ff00000;
    uVar2 = 0;
  }
  else {
    if (mode != Activating) {
      return;
    }
    *(undefined4 *)(this + 0x14) = 200;
    uVar1 = 0;
    uVar2 = 0x3ff00000;
  }
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined4 *)(this + 0x2c) = uVar1;
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x34) = uVar2;
  return;
}

Assistant:

QScrollbarStyleAnimation::QScrollbarStyleAnimation(Mode mode, QObject *target) : QNumberStyleAnimation(target), _mode(mode), _active(false)
{
    switch (mode) {
    case Activating:
        setDuration(ScrollBarFadeOutDuration);
        setStartValue(0.0);
        setEndValue(1.0);
        break;
    case Deactivating:
        setDuration(ScrollBarFadeOutDelay + ScrollBarFadeOutDuration);
        setDelay(ScrollBarFadeOutDelay);
        setStartValue(1.0);
        setEndValue(0.0);
        break;
    }
}